

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBox::showEvent(QComboBox *this,QShowEvent *e)

{
  long lVar1;
  byte bVar2;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  bVar2 = *(byte *)(lVar1 + 0x34c);
  if (((bVar2 & 1) == 0) && (*(int *)(lVar1 + 0x324) == 1)) {
    *(undefined8 *)(lVar1 + 0x318) = 0xffffffffffffffff;
    QWidget::updateGeometry(&this->super_QWidget);
    bVar2 = *(byte *)(lVar1 + 0x34c);
  }
  *(byte *)(lVar1 + 0x34c) = bVar2 | 1;
  QWidget::showEvent(&this->super_QWidget,e);
  return;
}

Assistant:

void QComboBox::showEvent(QShowEvent *e)
{
    Q_D(QComboBox);
    if (!d->shownOnce && d->sizeAdjustPolicy == QComboBox::AdjustToContentsOnFirstShow) {
        d->sizeHint = QSize();
        updateGeometry();
    }
    d->shownOnce = true;
    QWidget::showEvent(e);
}